

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBinaryOpType GetBinaryOpType(LexemeType type)

{
  SynBinaryOpType local_c;
  LexemeType type_local;
  
  switch(type) {
  case lex_add:
    local_c = SYN_BINARY_OP_ADD;
    break;
  case lex_sub:
    local_c = SYN_BINARY_OP_SUB;
    break;
  case lex_mul:
    local_c = SYN_BINARY_OP_MUL;
    break;
  case lex_div:
    local_c = SYN_BINARY_OP_DIV;
    break;
  case lex_mod:
    local_c = SYN_BINARY_OP_MOD;
    break;
  case lex_pow:
    local_c = SYN_BINARY_OP_POW;
    break;
  case lex_less:
    local_c = SYN_BINARY_OP_LESS;
    break;
  case lex_lequal:
    local_c = SYN_BINARY_OP_LESS_EQUAL;
    break;
  case lex_shl:
    local_c = SYN_BINARY_OP_SHL;
    break;
  case lex_greater:
    local_c = SYN_BINARY_OP_GREATER;
    break;
  case lex_gequal:
    local_c = SYN_BINARY_OP_GREATER_EQUAL;
    break;
  case lex_shr:
    local_c = SYN_BINARY_OP_SHR;
    break;
  case lex_equal:
    local_c = SYN_BINARY_OP_EQUAL;
    break;
  case lex_nequal:
    local_c = SYN_BINARY_OP_NOT_EQUAL;
    break;
  case lex_bitand:
    local_c = SYN_BINARY_OP_BIT_AND;
    break;
  case lex_bitor:
    local_c = SYN_BINARY_OP_BIT_OR;
    break;
  case lex_bitxor:
    local_c = SYN_BINARY_OP_BIT_XOR;
    break;
  case lex_logand:
    local_c = SYN_BINARY_OP_LOGICAL_AND;
    break;
  case lex_logor:
    local_c = SYN_BINARY_OP_LOGICAL_OR;
    break;
  case lex_logxor:
    local_c = SYN_BINARY_OP_LOGICAL_XOR;
    break;
  case lex_in:
    local_c = SYN_BINARY_OP_IN;
    break;
  default:
    local_c = SYN_BINARY_OP_UNKNOWN;
  }
  return local_c;
}

Assistant:

SynBinaryOpType GetBinaryOpType(LexemeType type)
{
	switch(type)
	{
	case lex_add:
		return SYN_BINARY_OP_ADD;
	case lex_sub:
		return SYN_BINARY_OP_SUB;
	case lex_mul:
		return SYN_BINARY_OP_MUL;
	case lex_div:
		return SYN_BINARY_OP_DIV;
	case lex_mod:
		return SYN_BINARY_OP_MOD;
	case lex_pow:
		return SYN_BINARY_OP_POW;
	case lex_less:
		return SYN_BINARY_OP_LESS;
	case lex_lequal:
		return SYN_BINARY_OP_LESS_EQUAL;
	case lex_shl:
		return SYN_BINARY_OP_SHL;
	case lex_greater:
		return SYN_BINARY_OP_GREATER;
	case lex_gequal:
		return SYN_BINARY_OP_GREATER_EQUAL;
	case lex_shr:
		return SYN_BINARY_OP_SHR;
	case lex_equal:
		return SYN_BINARY_OP_EQUAL;
	case lex_nequal:
		return SYN_BINARY_OP_NOT_EQUAL;
	case lex_bitand:
		return SYN_BINARY_OP_BIT_AND;
	case lex_bitor:
		return SYN_BINARY_OP_BIT_OR;
	case lex_bitxor:
		return SYN_BINARY_OP_BIT_XOR;
	case lex_logand:
		return SYN_BINARY_OP_LOGICAL_AND;
	case lex_logor:
		return SYN_BINARY_OP_LOGICAL_OR;
	case lex_logxor:
		return SYN_BINARY_OP_LOGICAL_XOR;
	case lex_in:
		return SYN_BINARY_OP_IN;
	default:
		break;
	}

	return SYN_BINARY_OP_UNKNOWN;
}